

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsC.cxx
# Opt level: O1

void __thiscall cmDependsC::Scan(cmDependsC *this,istream *is,char *directory,string *fullName)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  mapped_type pcVar6;
  mapped_type *ppcVar7;
  iterator iVar8;
  UnscannedEntry entry;
  string line;
  allocator local_119;
  string local_118;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_f8;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  queue<cmDependsC::UnscannedEntry,_std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>_>
  *local_90;
  char *local_88;
  cmDependsC *local_80;
  _Base_ptr local_78;
  mapped_type local_70;
  RegularExpression *local_68;
  RegularExpression *local_60;
  istream *local_58;
  string local_50;
  
  local_88 = directory;
  local_58 = is;
  pcVar6 = (mapped_type)operator_new(0x20);
  *(undefined8 *)
   ((long)&(pcVar6->UnscannedEntries).
           super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(pcVar6->UnscannedEntries).
           super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (pcVar6->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pcVar6->UnscannedEntries).
  super__Vector_base<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pcVar6->Used = true;
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDependsC::cmIncludeLines_*>_>_>
            ::operator[](&this->FileCache,fullName);
  *ppcVar7 = pcVar6;
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_60 = &this->IncludeRegexLine;
  pcVar1 = local_f0 + 0x10;
  paVar2 = &local_118.field_2;
  local_68 = &this->IncludeRegexScan;
  local_f8 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->Encountered;
  local_78 = &(this->Encountered)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_90 = &this->Unscanned;
  local_80 = this;
  local_70 = pcVar6;
  while (bVar4 = cmsys::SystemTools::GetLineFromStream(local_58,&local_b0,(bool *)0x0,-1), bVar4) {
    if ((this->TransformRules)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      TransformLine(this,&local_b0);
    }
    bVar4 = cmsys::RegularExpression::find(local_60,local_b0._M_dataplus._M_p);
    if (bVar4) {
      local_f0._8_8_ = 0;
      local_f0[0x10] = '\0';
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      pcVar3 = (this->IncludeRegexLine).startp[2];
      local_118._M_dataplus._M_p = (pointer)paVar2;
      local_f0._0_8_ = pcVar1;
      local_d0._M_p = (pointer)&local_c0;
      if (pcVar3 == (char *)0x0) {
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
      }
      else {
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,pcVar3,(this->IncludeRegexLine).endp[2]);
      }
      std::__cxx11::string::operator=((string *)local_f0,(string *)&local_118);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      cmsys::SystemTools::ConvertToUnixSlashes((string *)local_f0);
      pcVar3 = (this->IncludeRegexLine).startp[3];
      if (pcVar3 == (char *)0x0) {
        local_118._M_string_length = 0;
        local_118.field_2._M_local_buf[0] = '\0';
        local_118._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_118._M_dataplus._M_p = (pointer)paVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,pcVar3,(this->IncludeRegexLine).endp[3]);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_118);
      if (iVar5 == 0) {
        bVar4 = cmsys::SystemTools::FileIsFullPath((char *)local_f0._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != paVar2) {
          operator_delete(local_118._M_dataplus._M_p,
                          CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                   local_118.field_2._M_local_buf[0]) + 1);
        }
        this = local_80;
        if (!bVar4) {
          std::__cxx11::string::string((string *)&local_50,local_88,&local_119);
          cmSystemTools::CollapseCombinedPath(&local_118,&local_50,(string *)local_f0);
          std::__cxx11::string::operator=((string *)&local_d0,(string *)&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != paVar2) {
            operator_delete(local_118._M_dataplus._M_p,
                            CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                     local_118.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_118._M_dataplus._M_p != paVar2) {
        operator_delete(local_118._M_dataplus._M_p,
                        CONCAT71(local_118.field_2._M_allocated_capacity._1_7_,
                                 local_118.field_2._M_local_buf[0]) + 1);
      }
      bVar4 = cmsys::RegularExpression::find(local_68,(char *)local_f0._0_8_);
      if (bVar4) {
        std::vector<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
        push_back(&local_70->UnscannedEntries,(value_type *)local_f0);
        iVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_f8,(key_type *)local_f0);
        if (iVar8._M_node == local_78) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    (local_f8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_f0);
          std::deque<cmDependsC::UnscannedEntry,_std::allocator<cmDependsC::UnscannedEntry>_>::
          push_back(&local_90->c,(value_type *)local_f0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,
                        CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1)
        ;
      }
      if ((char *)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_,CONCAT71(local_f0._17_7_,local_f0[0x10]) + 1);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,
                    CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                             local_b0.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmDependsC::Scan(std::istream& is, const char* directory,
                      const std::string& fullName)
{
  cmIncludeLines* newCacheEntry = new cmIncludeLines;
  newCacheEntry->Used = true;
  this->FileCache[fullName] = newCacheEntry;

  // Read one line at a time.
  std::string line;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    // Transform the line content first.
    if (!this->TransformRules.empty()) {
      this->TransformLine(line);
    }

    // Match include directives.
    if (this->IncludeRegexLine.find(line.c_str())) {
      // Get the file being included.
      UnscannedEntry entry;
      entry.FileName = this->IncludeRegexLine.match(2);
      cmSystemTools::ConvertToUnixSlashes(entry.FileName);
      if (this->IncludeRegexLine.match(3) == "\"" &&
          !cmSystemTools::FileIsFullPath(entry.FileName.c_str())) {
        // This was a double-quoted include with a relative path.  We
        // must check for the file in the directory containing the
        // file we are scanning.
        entry.QuotedLocation =
          cmSystemTools::CollapseCombinedPath(directory, entry.FileName);
      }

      // Queue the file if it has not yet been encountered and it
      // matches the regular expression for recursive scanning.  Note
      // that this check does not account for the possibility of two
      // headers with the same name in different directories when one
      // is included by double-quotes and the other by angle brackets.
      // It also does not work properly if two header files with the same
      // name exist in different directories, and both are included from a
      // file their own directory by simply using "filename.h" (#12619)
      // This kind of problem will be fixed when a more
      // preprocessor-like implementation of this scanner is created.
      if (this->IncludeRegexScan.find(entry.FileName.c_str())) {
        newCacheEntry->UnscannedEntries.push_back(entry);
        if (this->Encountered.find(entry.FileName) ==
            this->Encountered.end()) {
          this->Encountered.insert(entry.FileName);
          this->Unscanned.push(entry);
        }
      }
    }
  }
}